

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

bool32 rw::d3d::rasterFromImage(Raster *raster,Image *image)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  Image *this;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint8 *puVar6;
  long lVar7;
  uint uVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  code *pcVar11;
  bool bVar12;
  Error _e;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  iVar2 = image->depth;
  this = (Image *)0x0;
  if ((iVar2 < 9) && (isP8supported == 0)) {
    this = Image::create(image->width,image->height,iVar2);
    this->stride = image->stride;
    puVar6 = image->palette;
    this->pixels = image->pixels;
    this->palette = puVar6;
    Image::unpalettize(this,false);
    iVar2 = this->depth;
    image = this;
  }
  uVar1 = raster->format;
  uVar4 = uVar1 & 0x6f00;
  uVar8 = iVar2 << 0x1e | iVar2 - 4U >> 2;
  if (7 < uVar8) goto switchD_00112b62_caseD_2;
  lVar7 = (long)nativeRasterOffset;
  switch(uVar8) {
  case 0:
    pcVar11 = conv_8_from_8;
    if ((uVar4 != 0x2500) && (uVar4 != 0x4500)) goto switchD_00112b62_caseD_2;
    break;
  case 1:
    if (uVar4 != 0x2500) goto switchD_00112b62_caseD_2;
    pcVar11 = conv_8_from_8;
    break;
  default:
    goto switchD_00112b62_caseD_2;
  case 3:
    if (uVar4 != 0x100) goto switchD_00112b62_caseD_2;
    pcVar11 = conv_ARGB1555_from_ARGB1555;
    break;
  case 5:
    if (uVar4 == 0x500) {
      pcVar11 = conv_BGRA8888_from_RGB888;
    }
    else {
LAB_00112bae:
      if (uVar4 != 0x600) {
switchD_00112b62_caseD_2:
        fprintf(_stderr,"%d %x\n");
        fflush(_stdout);
        _e.plugin = 0xb00;
        _e.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d.cpp"
                ,0x311);
        __stream = _stderr;
        pcVar3 = dbgsprint(0x8000000a);
        fprintf(__stream,"%s\n",pcVar3);
        setError(&_e);
        return 0;
      }
      pcVar11 = conv_BGR888_from_RGB888;
    }
    break;
  case 7:
    if (uVar4 != 0x500) goto LAB_00112bae;
    pcVar11 = conv_BGRA8888_from_RGBA8888;
  }
  if ((uVar1 >> 0xe & 1) == 0) {
    iVar2 = 0x100;
    if ((uVar1 >> 0xd & 1) == 0) goto LAB_00112bfe;
  }
  else {
    iVar2 = 0x10;
  }
  puVar6 = image->palette;
  puVar10 = *(uint8 **)((long)&raster->flags + lVar7);
  while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
    conv_RGBA8888_from_RGBA8888(puVar10,puVar6);
    puVar6 = puVar6 + 4;
    puVar10 = puVar10 + 4;
  }
LAB_00112bfe:
  puVar6 = raster->pixels;
  puVar10 = puVar6;
  if (puVar6 == (uint8 *)0x0) {
    Raster::lock(raster,0,5);
    puVar10 = raster->pixels;
  }
  for (iVar2 = 0; iVar2 < image->height; iVar2 = iVar2 + 1) {
    puVar9 = puVar10;
    for (iVar5 = 0; iVar5 < image->width; iVar5 = iVar5 + 1) {
      (*pcVar11)(puVar9);
      puVar9 = puVar9 + *(uint *)((long)&raster->depth + lVar7);
    }
    puVar10 = puVar10 + raster->stride;
  }
  if (puVar6 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  if (this == (Image *)0x0) {
    return 1;
  }
  Image::destroy(this);
  return 1;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8 && !isP8supported){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	int32 format = raster->format&(Raster::PAL8 | Raster::PAL4 | 0xF00);
	switch(image->depth){
	case 32:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(format == Raster::C1555)
			conv = conv_ARGB1555_from_ARGB1555;
		else
			goto err;
		break;
	case 8:
		if(format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	case 4:
		if(format == (Raster::PAL4 | Raster::C8888) ||
		   format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	default:
	err:
fprintf(stderr, "%d %x\n", image->depth, format); fflush(stdout);
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	int pallength = 0;
	if(raster->format & Raster::PAL4)
		pallength = 16;
	else if(raster->format & Raster::PAL8)
		pallength = 256;
	if(pallength){
		in = image->palette;
		out = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}